

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O2

int Gia_ManMultiProve(Gia_Man_t *p,Bmc_MulPar_t *pPars)

{
  int iVar1;
  void *__ptr;
  Aig_Man_t *p_00;
  Vec_Ptr_t *pVVar2;
  int i;
  int iVar3;
  
  pVVar2 = p->vSeqModelVec;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    for (iVar3 = 0; iVar3 < pVVar2->nSize; iVar3 = iVar3 + 1) {
      __ptr = Vec_PtrEntry(pVVar2,iVar3);
      if ((void *)0x2 < __ptr) {
        free(__ptr);
      }
    }
    free(pVVar2->pArray);
    free(pVVar2);
    p->vSeqModelVec = (Vec_Ptr_t *)0x0;
  }
  p_00 = Gia_ManToAig(p,0);
  pVVar2 = Gia_ManMultiProveAig(p_00,pPars);
  p->vSeqModelVec = pVVar2;
  iVar3 = pVVar2->nSize;
  if (iVar3 == p->vCos->nSize - p->nRegs) {
    iVar1 = Vec_PtrCountZero(pVVar2);
    return -(uint)(iVar1 == iVar3);
  }
  __assert_fail("Vec_PtrSize(p->vSeqModelVec) == Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMulti.c"
                ,0x11e,"int Gia_ManMultiProve(Gia_Man_t *, Bmc_MulPar_t *)");
}

Assistant:

int Gia_ManMultiProve( Gia_Man_t * p, Bmc_MulPar_t * pPars )
{
    Aig_Man_t * pAig;
    if ( p->vSeqModelVec )
        Vec_PtrFreeFree( p->vSeqModelVec ), p->vSeqModelVec = NULL;
    pAig = Gia_ManToAig( p, 0 );
    p->vSeqModelVec = Gia_ManMultiProveAig( pAig, pPars ); // deletes pAig
    assert( Vec_PtrSize(p->vSeqModelVec) == Gia_ManPoNum(p) );
    return Vec_PtrCountZero(p->vSeqModelVec) == Vec_PtrSize(p->vSeqModelVec) ? -1 : 0;
}